

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O2

void Rml::ElementUtilities::GetElementsByClassName
               (ElementList *elements,Element *root_element,String *class_name)

{
  bool bVar1;
  int iVar2;
  int i;
  int iVar3;
  Element *element;
  SearchQueue search_queue;
  Element *local_90;
  Element *local_88;
  _Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> local_80;
  
  ::std::queue<Rml::Element*,std::deque<Rml::Element*,std::allocator<Rml::Element*>>>::
  queue<std::deque<Rml::Element*,std::allocator<Rml::Element*>>,void>
            ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
             &local_80);
  iVar3 = 0;
  while( true ) {
    iVar2 = Element::GetNumChildren(root_element,false);
    if (iVar2 <= iVar3) break;
    local_90 = Element::GetChild(root_element,iVar3);
    ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
              ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_80,&local_90);
    iVar3 = iVar3 + 1;
  }
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_90 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    ::std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>::pop_front
              ((deque<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)&local_80);
    bVar1 = Element::IsClassSet(local_90,class_name);
    if (bVar1) {
      ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::push_back(elements,&local_90);
    }
    iVar3 = 0;
    while( true ) {
      iVar2 = Element::GetNumChildren(local_90,false);
      if (iVar2 <= iVar3) break;
      local_88 = Element::GetChild(local_90,iVar3);
      ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
                ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_80,&local_88);
      iVar3 = iVar3 + 1;
    }
  }
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Deque_base(&local_80);
  return;
}

Assistant:

void ElementUtilities::GetElementsByClassName(ElementList& elements, Element* root_element, const String& class_name)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	for (int i = 0; i < root_element->GetNumChildren(); ++i)
		search_queue.push(root_element->GetChild(i));

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->IsClassSet(class_name))
			elements.push_back(element);

		// Add all children to search.
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}
}